

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fctkern__log_chk(fctkern_t *nk,fctchk_t *chk)

{
  size_t sVar1;
  fct_logger_i *logger_00;
  fct_logger_i *logger;
  size_t num_itemslogger;
  size_t item_ilogger;
  fctchk_t *chk_local;
  fctkern_t *nk_local;
  
  if (nk == (fctkern_t *)0x0) {
    __assert_fail("nk != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x94b
                  ,"void fctkern__log_chk(fctkern_t *, const fctchk_t *)");
  }
  if (chk == (fctchk_t *)0x0) {
    __assert_fail("chk != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x94c
                  ,"void fctkern__log_chk(fctkern_t *, const fctchk_t *)");
  }
  if (nk != (fctkern_t *)0xfffffffffffffe68) {
    sVar1 = fct_nlist__size(&nk->logger_list);
    for (num_itemslogger = 0; num_itemslogger != sVar1; num_itemslogger = num_itemslogger + 1) {
      logger_00 = (fct_logger_i *)fct_nlist__at(&nk->logger_list,num_itemslogger);
      fct_logger__on_chk(logger_00,chk);
    }
  }
  return;
}

Assistant:

static void
fctkern__log_chk(fctkern_t *nk, fctchk_t const *chk)
{
    FCT_ASSERT( nk != NULL );
    FCT_ASSERT( chk != NULL );
    FCT_NLIST_FOREACH_BGN(fct_logger_i*, logger, &(nk->logger_list))
    {
        fct_logger__on_chk(logger, chk);
    }
    FCT_NLIST_FOREACH_END();
}